

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

time_t hostcache_prune(Curl_hash *hostcache,int cache_timeout,time_t now)

{
  time_t local_38;
  hostcache_prune_data user;
  time_t now_local;
  int cache_timeout_local;
  Curl_hash *hostcache_local;
  
  user.now = 0;
  local_38 = now;
  user.oldest._0_4_ = cache_timeout;
  user._16_8_ = now;
  Curl_hash_clean_with_criterium(hostcache,&local_38,hostcache_entry_is_stale);
  return user.now;
}

Assistant:

static time_t
hostcache_prune(struct Curl_hash *hostcache, int cache_timeout,
                time_t now)
{
  struct hostcache_prune_data user;

  user.max_age_sec = cache_timeout;
  user.now = now;
  user.oldest = 0;

  Curl_hash_clean_with_criterium(hostcache,
                                 (void *) &user,
                                 hostcache_entry_is_stale);

  return user.oldest;
}